

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlfparser.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
xlfparser::Token::value<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Token *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *string)

{
  ulong uVar1;
  size_type sVar2;
  invalid_token *this_00;
  allocator<char> local_41;
  string local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *string_local;
  Token *this_local;
  
  uVar1 = this->m_end;
  local_20 = string;
  string_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  this_local = (Token *)__return_storage_ptr__;
  sVar2 = Catch::clara::std::__cxx11::
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size(string);
  if ((uVar1 < sVar2) && (this->m_start <= this->m_end)) {
    Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    substr(__return_storage_ptr__,local_20,this->m_start,(this->m_end + 1) - this->m_start);
    return __return_storage_ptr__;
  }
  this_00 = (invalid_token *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Token index out of range",&local_41);
  invalid_token::invalid_token(this_00,&local_40);
  __cxa_throw(this_00,&invalid_token::typeinfo,invalid_token::~invalid_token);
}

Assistant:

string_type value(const string_type& string) const
        {
            if (m_end >= string.size() || m_start > m_end)
                throw invalid_token("Token index out of range");

            return string.substr(m_start, m_end + 1 - m_start);
        }